

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariables.h
# Opt level: O0

void __thiscall
cmDebugger::cmDebuggerVariableEntry::~cmDebuggerVariableEntry(cmDebuggerVariableEntry *this)

{
  cmDebuggerVariableEntry *this_local;
  
  std::__cxx11::string::~string((string *)&this->Type);
  std::__cxx11::string::~string((string *)&this->Value);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmDebuggerVariableEntry()
    : cmDebuggerVariableEntry("", "", "")
  {
  }